

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  uint uVar322;
  ulong uVar323;
  ulong uVar324;
  long lVar325;
  ulong uVar326;
  long lVar327;
  ulong uVar328;
  uint16_t *a_00;
  secp256k1_fe *a_01;
  ulong uVar329;
  secp256k1_fe *r;
  secp256k1_fe *psVar330;
  ulong uVar331;
  ulong uVar332;
  ulong uVar333;
  ulong uVar334;
  ulong uVar335;
  ulong uVar336;
  ulong uVar337;
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  uint16_t t16 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe sStack_2a0;
  secp256k1_fe sStack_278;
  secp256k1_fe *psStack_250;
  secp256k1_fe *psStack_248;
  secp256k1_fe *psStack_240;
  undefined8 local_230;
  ulong local_228;
  undefined1 local_220 [16];
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  secp256k1_fe local_1e8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  secp256k1_fe *local_198;
  secp256k1_fe *local_190;
  ushort auStack_188 [16];
  uint16_t local_168 [16];
  uint16_t local_148 [16];
  ushort local_128 [16];
  ushort local_108 [16];
  ushort local_e8 [16];
  secp256k1_fe local_c8;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  uVar328 = a->n[0];
  uVar3 = a->n[1];
  uVar4 = a->n[2];
  uVar5 = a->n[3];
  local_1f8 = a->n[4];
  if (use_sqr == 0) {
    local_228 = b->n[3];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_228;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar328;
    uVar332 = b->n[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar332;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar3;
    local_200 = b->n[0];
    local_208 = b->n[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_208;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar4;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_200;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar5;
    local_1c0 = b->n[4];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_1c0;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = local_1f8;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = SUB168(auVar31 * auVar191,0);
    auVar29 = auVar28 * auVar188 + auVar27 * auVar187 + auVar29 * auVar189 + auVar30 * auVar190 +
              auVar32 * ZEXT816(0x1000003d10);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_1c0;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar328;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_228;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar3;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar332;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar4;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_208;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar5;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_200;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = local_1f8;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = SUB168(auVar31 * auVar191,8);
    auVar27 = auVar38 * ZEXT816(0x1000003d10000) +
              auVar33 * auVar192 +
              auVar37 * auVar196 + auVar36 * auVar195 + auVar35 * auVar194 + auVar34 * auVar193 +
              (auVar29 >> 0x34);
    local_1f0 = auVar27._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_200;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar328;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_1c0;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar3;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_228;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar4;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar332;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar5;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_208;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = local_1f8;
    auVar26 = (auVar27 >> 0x34) +
              auVar43 * auVar201 + auVar42 * auVar200 + auVar41 * auVar199 + auVar40 * auVar198;
    uVar324 = auVar26._0_8_;
    uVar335 = auVar26._8_8_;
    auVar308._8_8_ = uVar335 >> 0x34;
    auVar308._0_8_ = uVar335 * 0x1000 | uVar324 >> 0x34;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar324 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar27._6_2_ & 0xf);
    auVar27 = auVar39 * auVar197 + auVar44 * ZEXT816(0x1000003d1);
    uVar324 = auVar27._0_8_;
    uVar335 = auVar27._8_8_;
    local_210 = uVar324 & 0xfffffffffffff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_208;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar328;
    local_220 = auVar45 * auVar202;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_200;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar3;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_1c0;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar4;
    auVar303._8_8_ = uVar335 >> 0x34;
    auVar303._0_8_ = uVar335 * 0x1000 | uVar324 >> 0x34;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_228;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar5;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar332;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = local_1f8;
    auVar308 = auVar47 * auVar204 + auVar49 * auVar206 + auVar48 * auVar205 + auVar308;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auVar308._0_8_ & 0xfffffffffffff;
    auVar303 = auVar50 * ZEXT816(0x1000003d10) + auVar46 * auVar203 + local_220 + auVar303;
    uVar324 = auVar303._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar332;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar328;
    auVar302 = auVar51 * auVar207;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_208;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar3;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_200;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar4;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_1c0;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar5;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_228;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = local_1f8;
    auVar27 = auVar55 * auVar211 + auVar54 * auVar210 + (auVar308 >> 0x34);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auVar27._0_8_;
    auVar28 = auVar56 * ZEXT816(0x1000003d10) + auVar53 * auVar209 + auVar52 * auVar208 + auVar302 +
              (auVar303 >> 0x34);
    uVar335 = auVar28._8_8_ << 0xc | auVar28._0_8_ >> 0x34;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auVar27._8_8_;
    auVar26 = auVar57 * ZEXT816(0x1000003d10000);
    uVar332 = auVar29._0_8_ & 0xfffffffffffff;
    local_1e8.n[0] = local_210;
    local_1b8 = uVar4;
    local_1b0 = uVar328;
    local_1a8 = uVar5;
    local_1a0 = uVar3;
  }
  else {
    local_200 = uVar328 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar5;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = local_200;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar4;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar3 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1f8;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = local_1f8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar8 * auVar174,0);
    auVar26 = auVar7 * auVar173 + auVar6 * auVar172 + auVar9 * ZEXT816(0x1000003d10);
    uVar323 = auVar26._0_8_;
    local_1f8 = local_1f8 * 2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_1f8;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar328;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar5;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar3 * 2;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar4;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar4;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SUB168(auVar8 * auVar174,8);
    auVar26 = auVar13 * ZEXT816(0x1000003d10000) +
              auVar10 * auVar175 + auVar12 * auVar177 + auVar11 * auVar176 + (auVar26 >> 0x34);
    local_1f0 = auVar26._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar328;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar328;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_1f8;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar3;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar5;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar4 * 2;
    auVar27 = auVar16 * auVar180 + auVar15 * auVar179 + (auVar26 >> 0x34);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (auVar27._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar26._6_2_ & 0xf);
    auVar26 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar178;
    local_208 = auVar26._0_8_ & 0xfffffffffffff;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar3;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_200;
    auVar302._8_8_ = uVar5;
    auVar302._0_8_ = SUB168(auVar18 * auVar181,8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_1f8;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar4;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar5;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar5;
    auVar28 = auVar20 * auVar183 + auVar19 * auVar182 + (auVar27 >> 0x34);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar28._0_8_ & 0xfffffffffffff;
    auVar26 = auVar21 * ZEXT816(0x1000003d10) + auVar18 * auVar181 + (auVar26 >> 0x34);
    uVar324 = auVar26._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar4;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = local_200;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar3;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar3;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_1f8;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar5;
    auVar29 = auVar24 * auVar186 + (auVar28 >> 0x34);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar29._0_8_;
    auVar28 = auVar25 * ZEXT816(0x1000003d10) + auVar22 * auVar184 + auVar23 * auVar185 +
              (auVar26 >> 0x34);
    uVar335 = auVar28._8_8_ << 0xc | auVar28._0_8_ >> 0x34;
    uVar332 = uVar323 & 0xffffffffffffe;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar29._8_8_;
    auVar26 = auVar26 * ZEXT816(0x1000003d10000);
    local_228 = uVar3;
    local_1f8 = uVar323;
    local_1e8.n[0] = local_208;
  }
  local_1e8.n[2] = auVar28._0_8_ & 0xfffffffffffff;
  local_1e8.n[1] = uVar324 & 0xfffffffffffff;
  local_230 = auVar302._8_8_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar335;
  auVar309._8_8_ = auVar28._8_8_ >> 0x34;
  auVar309._0_8_ = uVar332;
  auVar320 = auVar26 + auVar309 + auVar320;
  local_1e8.n[3] = auVar320._0_8_;
  local_1e8.n[4] = (local_1f0 & 0xffffffffffff) + (auVar320._8_8_ * 0x1000 | local_1e8.n[3] >> 0x34)
  ;
  local_1e8.n[3] = local_1e8.n[3] & 0xfffffffffffff;
  local_58.n[0] = a->n[0];
  local_58.n[1] = a->n[1];
  local_58.n[2] = a->n[2];
  local_58.n[3] = a->n[3];
  local_58.n[4] = a->n[4];
  local_88.n[0] = b->n[0];
  local_88.n[1] = b->n[1];
  local_88.n[2] = b->n[2];
  local_88.n[3] = b->n[3];
  local_88.n[4] = b->n[4];
  psStack_240 = (secp256k1_fe *)0x1624e2;
  local_198 = b;
  local_190 = a;
  secp256k1_fe_impl_normalize_var(&local_1e8);
  psStack_240 = (secp256k1_fe *)0x1624ea;
  secp256k1_fe_impl_normalize_var(&local_58);
  psStack_240 = (secp256k1_fe *)0x1624f2;
  secp256k1_fe_impl_normalize_var(&local_88);
  psStack_240 = (secp256k1_fe *)0x162502;
  secp256k1_fe_impl_get_b32((uchar *)local_e8,&local_58);
  psStack_240 = (secp256k1_fe *)0x162512;
  secp256k1_fe_impl_get_b32((uchar *)local_108,&local_88);
  psStack_240 = (secp256k1_fe *)0x162522;
  secp256k1_fe_impl_get_b32((uchar *)local_128,&local_1e8);
  lVar325 = 0x10;
  lVar327 = 0;
  do {
    uVar1 = local_108[lVar325 + -1];
    *(ushort *)((long)local_148 + lVar327) =
         local_e8[lVar325 + -1] << 8 | local_e8[lVar325 + -1] >> 8;
    uVar2 = local_128[lVar325 + -1];
    *(ushort *)((long)local_168 + lVar327) = uVar1 << 8 | uVar1 >> 8;
    *(ushort *)((long)auStack_188 + lVar327) = uVar2 << 8 | uVar2 >> 8;
    lVar327 = lVar327 + 2;
    lVar325 = lVar325 + -1;
  } while (lVar325 != 0);
  a_01 = &local_c8;
  a_00 = local_148;
  psStack_240 = (secp256k1_fe *)0x162592;
  mulmod256((uint16_t *)a_01,a_00,local_168,test_fe_mul::m16);
  lVar325 = 0;
  while (*(char *)((long)local_c8.n + lVar325) == *(char *)((long)auStack_188 + lVar325)) {
    lVar325 = lVar325 + 1;
    if (lVar325 == 0x20) {
      return;
    }
  }
  psStack_240 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_1();
  psVar330 = &sStack_2a0;
  r = &sStack_278;
  psStack_250 = &local_1e8;
  psStack_248 = &local_58;
  psStack_240 = &local_88;
  uVar322 = secp256k1_fe_sqrt(r,a_01);
  if (uVar322 != (a_00 == (uint16_t *)0x0)) {
    if (a_00 != (uint16_t *)0x0) {
      sStack_2a0.n[0] = (*(long *)a_00 - sStack_278.n[0]) + 0x3ffffbfffff0bc;
      a_01 = (secp256k1_fe *)0x3ffffffffffffc;
      sStack_2a0.n[1] = (*(long *)(a_00 + 4) - sStack_278.n[1]) + 0x3ffffffffffffc;
      sStack_2a0.n[2] = (*(long *)(a_00 + 8) - sStack_278.n[2]) + 0x3ffffffffffffc;
      sStack_2a0.n[3] = (*(long *)(a_00 + 0xc) - sStack_278.n[3]) + 0x3ffffffffffffc;
      sStack_2a0.n[4] = (*(long *)(a_00 + 0x10) - sStack_278.n[4]) + 0x3fffffffffffc;
      sStack_278.n[0] = *(long *)a_00 + sStack_278.n[0];
      sStack_278.n[1] = *(long *)(a_00 + 4) + sStack_278.n[1];
      sStack_278.n[2] = *(long *)(a_00 + 8) + sStack_278.n[2];
      sStack_278.n[3] = *(long *)(a_00 + 0xc) + sStack_278.n[3];
      sStack_278.n[4] = *(long *)(a_00 + 0x10) + sStack_278.n[4];
      secp256k1_fe_impl_normalize(&sStack_278);
      secp256k1_fe_impl_normalize(&sStack_2a0);
      if ((((sStack_278.n[3] != 0 || sStack_278.n[1] != 0) ||
           (sStack_278.n[2] != 0 || sStack_278.n[0] != 0)) || sStack_278.n[4] != 0) &&
         (r = psVar330,
         ((sStack_2a0.n[3] != 0 || sStack_2a0.n[1] != 0) ||
         (sStack_2a0.n[2] != 0 || sStack_2a0.n[0] != 0)) || sStack_2a0.n[4] != 0))
      goto LAB_001626fe;
    }
    return;
  }
  test_sqrt_cold_2();
LAB_001626fe:
  test_sqrt_cold_1();
  testutil_random_fe_non_zero_test(r + 2);
  uVar3 = r[2].n[0];
  uVar4 = r[2].n[1];
  uVar5 = r[2].n[3];
  uVar328 = uVar3 * 2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar5;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar328;
  uVar332 = r[2].n[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar332;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar4 * 2;
  uVar324 = r[2].n[4];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar324;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar324;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = SUB168(auVar60 * auVar214,0);
  auVar27 = auVar61 * ZEXT816(0x1000003d10) + auVar59 * auVar213 + auVar58 * auVar212;
  uVar335 = uVar324 * 2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar335;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar3;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar5;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar4 * 2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar332;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar332;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = SUB168(auVar60 * auVar214,8);
  auVar29 = auVar65 * ZEXT816(0x1000003d10000) +
            auVar62 * auVar215 + auVar64 * auVar217 + auVar63 * auVar216 + (auVar27 >> 0x34);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar3;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar3;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar335;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar5;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar332 * 2;
  auVar26 = auVar68 * auVar220 + auVar67 * auVar219 + (auVar29 >> 0x34);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = (auVar26._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar29._6_2_ & 0xf);
  auVar28 = auVar69 * ZEXT816(0x1000003d1) + auVar66 * auVar218;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar4;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar328;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar335;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar332;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar5;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar5;
  auVar26 = auVar72 * auVar223 + auVar71 * auVar222 + (auVar26 >> 0x34);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar26._0_8_ & 0xfffffffffffff;
  auVar30 = (auVar28 >> 0x34) + auVar70 * auVar221 + auVar73 * ZEXT816(0x1000003d10);
  uVar323 = auVar30._0_8_;
  uVar336 = auVar30._8_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar332;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar328;
  auVar310._8_8_ = uVar336 >> 0x34;
  auVar310._0_8_ = uVar336 * 0x1000 | uVar323 >> 0x34;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar4;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar4;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar335;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar5;
  auVar26 = auVar76 * auVar226 + (auVar26 >> 0x34);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = auVar26._0_8_;
  auVar310 = auVar77 * ZEXT816(0x1000003d10) + auVar75 * auVar225 + auVar74 * auVar224 + auVar310;
  auVar30 = auVar310 >> 0x34;
  auVar311._8_8_ = auVar30._8_8_;
  auVar311._0_8_ = auVar27._0_8_ & 0xffffffffffffe;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = auVar30._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar26._8_8_;
  auVar312 = auVar78 * ZEXT816(0x1000003d10000) + auVar311 + auVar312;
  uVar333 = auVar312._0_8_;
  uVar335 = auVar28._0_8_ & 0xfffffffffffff;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar335;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar5;
  uVar334 = (auVar312._8_8_ << 0xc | uVar333 >> 0x34) + (auVar29._0_8_ & 0xffffffffffff);
  uVar323 = uVar323 & 0xfffffffffffff;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar323;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar332;
  uVar337 = auVar310._0_8_ & 0xfffffffffffff;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar337;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar4;
  uVar333 = uVar333 & 0xfffffffffffff;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar333;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar3;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar334;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar324;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = SUB168(auVar83 * auVar231,0);
  auVar27 = auVar84 * ZEXT816(0x1000003d10) +
            auVar80 * auVar228 + auVar79 * auVar227 + auVar81 * auVar229 + auVar82 * auVar230;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar335;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar324;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar323;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar5;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar337;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar332;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar333;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar4;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar334;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar3;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = SUB168(auVar83 * auVar231,8);
  auVar29 = auVar90 * ZEXT816(0x1000003d10000) +
            auVar87 * auVar234 + auVar85 * auVar232 + auVar86 * auVar233 + auVar88 * auVar235 +
            auVar89 * auVar236 + (auVar27 >> 0x34);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar335;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar3;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar323;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar324;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar337;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar5;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar333;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar332;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar334;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar4;
  auVar26 = auVar95 * auVar241 + auVar92 * auVar238 + auVar93 * auVar239 + auVar94 * auVar240 +
            (auVar29 >> 0x34);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = (auVar26._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar29._6_2_ & 0xf);
  auVar28 = auVar91 * auVar237 + auVar96 * ZEXT816(0x1000003d1);
  uVar326 = auVar28._0_8_;
  uVar328 = auVar28._8_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar335;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar4;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar323;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar3;
  auVar304._8_8_ = uVar328 >> 0x34;
  auVar304._0_8_ = uVar328 * 0x1000 | uVar326 >> 0x34;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar337;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar324;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar333;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar5;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar334;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar332;
  auVar26 = auVar101 * auVar246 + auVar100 * auVar245 + auVar99 * auVar244 + (auVar26 >> 0x34);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar26._0_8_ & 0xfffffffffffff;
  auVar304 = auVar102 * ZEXT816(0x1000003d10) + auVar97 * auVar242 + auVar98 * auVar243 + auVar304;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar335;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar332;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar323;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar4;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar337;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar3;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar333;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar324;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar334;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar5;
  auVar26 = auVar107 * auVar251 + auVar106 * auVar250 + (auVar26 >> 0x34);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar26._0_8_;
  auVar28 = auVar108 * ZEXT816(0x1000003d10) +
            auVar105 * auVar249 + auVar104 * auVar248 + auVar103 * auVar247 + (auVar304 >> 0x34);
  auVar30 = auVar28 >> 0x34;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = auVar30._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar26._8_8_;
  auVar313._8_8_ = auVar30._8_8_;
  auVar313._0_8_ = auVar27._0_8_ & 0xfffffffffffff;
  auVar314 = auVar109 * ZEXT816(0x1000003d10000) + auVar313 + auVar314;
  uVar336 = auVar314._0_8_;
  uVar328 = a_01->n[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar333;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar328;
  uVar3 = a_01->n[1];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar337;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar3;
  uVar4 = a_01->n[2];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar323;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar4;
  uVar5 = a_01->n[3];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar335;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar5;
  uVar332 = a_01->n[4];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar334;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar332;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = SUB168(auVar114 * auVar256,0);
  uVar329 = (auVar314._8_8_ << 0xc | uVar336 >> 0x34) + (auVar29._0_8_ & 0xffffffffffff);
  auVar27 = auVar115 * ZEXT816(0x1000003d10) +
            auVar111 * auVar253 + auVar113 * auVar255 + auVar112 * auVar254 + auVar110 * auVar252;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar334;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar328;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar333;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar3;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar337;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar4;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar323;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar5;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar335;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar332;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = SUB168(auVar114 * auVar256,8);
  auVar26 = auVar121 * ZEXT816(0x1000003d10000) +
            auVar117 * auVar258 + auVar118 * auVar259 + auVar120 * auVar261 + auVar119 * auVar260 +
            auVar116 * auVar257 + (auVar27 >> 0x34);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar335;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar328;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar334;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar3;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar333;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar4;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar337;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar5;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar323;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar332;
  auVar29 = (auVar26 >> 0x34) +
            auVar126 * auVar266 + auVar125 * auVar265 + auVar124 * auVar264 + auVar123 * auVar263;
  uVar324 = auVar29._0_8_;
  uVar331 = auVar29._8_8_;
  auVar315._8_8_ = uVar331 >> 0x34;
  auVar315._0_8_ = uVar331 * 0x1000 | uVar324 >> 0x34;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar324 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar26._6_2_ & 0xf);
  auVar29 = auVar127 * ZEXT816(0x1000003d1) + auVar122 * auVar262;
  uVar324 = auVar29._0_8_;
  uVar331 = auVar29._8_8_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar323;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar328;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar335;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar3;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar334;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar4;
  auVar305._8_8_ = uVar331 >> 0x34;
  auVar305._0_8_ = uVar331 * 0x1000 | uVar324 >> 0x34;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar333;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar5;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar337;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar332;
  auVar315 = auVar130 * auVar269 + auVar132 * auVar271 + auVar131 * auVar270 + auVar315;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = auVar315._0_8_ & 0xfffffffffffff;
  auVar305 = auVar133 * ZEXT816(0x1000003d10) + auVar129 * auVar268 + auVar128 * auVar267 + auVar305
  ;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar337;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar328;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar323;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar3;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar335;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar4;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar334;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar5;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar333;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar332;
  auVar29 = auVar138 * auVar276 + auVar137 * auVar275 + (auVar315 >> 0x34);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = auVar29._0_8_;
  auVar30 = auVar139 * ZEXT816(0x1000003d10) +
            auVar134 * auVar272 + auVar136 * auVar274 + auVar135 * auVar273 + (auVar305 >> 0x34);
  r->n[0] = uVar324 & 0xfffffffffffff;
  auVar31 = auVar30 >> 0x34;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = auVar31._0_8_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar29._8_8_;
  auVar316._8_8_ = auVar31._8_8_;
  auVar316._0_8_ = auVar27._0_8_ & 0xfffffffffffff;
  r->n[1] = auVar305._0_8_ & 0xfffffffffffff;
  auVar317 = auVar140 * ZEXT816(0x1000003d10000) + auVar316 + auVar317;
  uVar328 = auVar317._0_8_;
  r->n[2] = auVar30._0_8_ & 0xfffffffffffff;
  r->n[3] = uVar328 & 0xfffffffffffff;
  r->n[4] = (auVar317._8_8_ << 0xc | uVar328 >> 0x34) + (auVar26._0_8_ & 0xffffffffffff);
  uVar328 = a_01[1].n[0];
  uVar336 = uVar336 & 0xfffffffffffff;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar336;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar328;
  uVar324 = auVar28._0_8_ & 0xfffffffffffff;
  uVar3 = a_01[1].n[1];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar324;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar3;
  uVar331 = auVar304._0_8_ & 0xfffffffffffff;
  uVar4 = a_01[1].n[2];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar331;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar4;
  uVar326 = uVar326 & 0xfffffffffffff;
  uVar5 = a_01[1].n[3];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar326;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar5;
  uVar332 = a_01[1].n[4];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar329;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar332;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = SUB168(auVar145 * auVar281,0);
  auVar27 = auVar146 * ZEXT816(0x1000003d10) +
            auVar141 * auVar277 + auVar142 * auVar278 + auVar144 * auVar280 + auVar143 * auVar279;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar329;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar328;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar336;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar3;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar324;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar4;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar331;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar5;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar326;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar332;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = SUB168(auVar145 * auVar281,8);
  auVar26 = auVar152 * ZEXT816(0x1000003d10000) +
            auVar147 * auVar282 +
            auVar148 * auVar283 + auVar149 * auVar284 + auVar151 * auVar286 + auVar150 * auVar285 +
            (auVar27 >> 0x34);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar326;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar328;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar329;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar3;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar336;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar4;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar324;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar5;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar331;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar332;
  auVar28 = (auVar26 >> 0x34) +
            auVar155 * auVar289 + auVar157 * auVar291 + auVar156 * auVar290 + auVar154 * auVar288;
  uVar335 = auVar28._0_8_;
  uVar323 = auVar28._8_8_;
  auVar321._8_8_ = uVar323 >> 0x34;
  auVar321._0_8_ = uVar323 * 0x1000 | uVar335 >> 0x34;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar335 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar26._6_2_ & 0xf);
  auVar28 = auVar153 * auVar287 + auVar158 * ZEXT816(0x1000003d1);
  uVar335 = auVar28._0_8_;
  uVar323 = auVar28._8_8_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar331;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar328;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar326;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar3;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar329;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar4;
  auVar306._8_8_ = uVar323 >> 0x34;
  auVar306._0_8_ = uVar323 * 0x1000 | uVar335 >> 0x34;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar336;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar5;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar324;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar332;
  auVar321 = auVar161 * auVar294 + auVar163 * auVar296 + auVar162 * auVar295 + auVar321;
  uVar333 = auVar321._0_8_;
  uVar323 = auVar321._8_8_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar333 & 0xfffffffffffff;
  auVar306 = auVar164 * ZEXT816(0x1000003d10) + auVar159 * auVar292 + auVar160 * auVar293 + auVar306
  ;
  auVar307._8_8_ = uVar323 >> 0x34;
  auVar307._0_8_ = uVar323 * 0x1000 | uVar333 >> 0x34;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar324;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar328;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar331;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar3;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar326;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar4;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar329;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar5;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar336;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar332;
  auVar307 = auVar169 * auVar301 + auVar168 * auVar300 + auVar307;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = auVar307._0_8_;
  r[1].n[0] = uVar335 & 0xfffffffffffff;
  auVar28 = auVar170 * ZEXT816(0x1000003d10) +
            auVar165 * auVar297 + auVar167 * auVar299 + auVar166 * auVar298 + (auVar306 >> 0x34);
  r[1].n[1] = auVar306._0_8_ & 0xfffffffffffff;
  auVar29 = auVar28 >> 0x34;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = auVar29._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = auVar307._8_8_;
  auVar318._8_8_ = auVar29._8_8_;
  auVar318._0_8_ = auVar27._0_8_ & 0xfffffffffffff;
  r[1].n[2] = auVar28._0_8_ & 0xfffffffffffff;
  auVar319 = auVar171 * ZEXT816(0x1000003d10000) + auVar318 + auVar319;
  uVar328 = auVar319._0_8_;
  r[1].n[3] = uVar328 & 0xfffffffffffff;
  r[1].n[4] = (auVar319._8_8_ << 0xc | uVar328 >> 0x34) + (auVar26._0_8_ & 0xffffffffffff);
  *(int *)r[3].n = (int)a_01[2].n[0];
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}